

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
__thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *__p;
  
  __p = (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)operator_new(0x30);
  (__p->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MonomorphicImpl_003a4c40;
  __p[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)(__p + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(__p + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  *(undefined2 *)&__p[5].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       *(undefined2 *)(this + 0x20);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003a0858;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
            (&(__return_storage_ptr__->
              super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ).impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003a0810;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<const T&>(impl_));
  }